

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall presolve::HPresolve::markRowDeleted(HPresolve *this,HighsInt row)

{
  double dVar1;
  reference pvVar2;
  iterator iVar3;
  reference pvVar4;
  reference pvVar5;
  int in_ESI;
  const_iterator in_RDI;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *in_stack_ffffffffffffffa8;
  _Base_ptr this_00;
  set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
  *in_stack_ffffffffffffffb0;
  bool local_31;
  _Self local_18;
  int local_c;
  
  local_c = in_ESI;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*(long *)in_RDI._M_node + 0x50),
                      (long)in_ESI);
  dVar1 = *pvVar2;
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*(long *)in_RDI._M_node + 0x68),
                      (long)local_c);
  local_31 = false;
  if ((dVar1 == *pvVar2) && (!NAN(dVar1) && !NAN(*pvVar2))) {
    in_stack_ffffffffffffffb0 =
         (set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          *)std::
            vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
            ::operator[]((vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
                          *)&in_RDI._M_node[0x2b]._M_left,(long)local_c);
    local_18._M_node =
         (_Base_ptr)
         std::
         set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
         ::end(in_stack_ffffffffffffffa8);
    local_31 = std::operator!=((_Self *)in_stack_ffffffffffffffb0,&local_18);
  }
  if (local_31 != false) {
    this_00 = in_RDI._M_node + 0x2a;
    std::
    vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
    ::operator[]((vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
                  *)&in_RDI._M_node[0x2b]._M_left,(long)local_c);
    std::set<std::pair<int,int>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>::
    erase_abi_cxx11_(in_stack_ffffffffffffffb0,in_RDI);
    iVar3 = std::
            set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
            ::end(this_00);
    pvVar4 = std::
             vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
             ::operator[]((vector<std::_Rb_tree_const_iterator<std::pair<int,_int>_>,_std::allocator<std::_Rb_tree_const_iterator<std::pair<int,_int>_>_>_>
                           *)&in_RDI._M_node[0x2b]._M_left,(long)local_c);
    pvVar4->_M_node = iVar3._M_node;
  }
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &in_RDI._M_node[0x25]._M_parent,(long)local_c);
  *pvVar5 = '\x01';
  pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      &in_RDI._M_node[0x2e]._M_parent,(long)local_c);
  *pvVar5 = '\x01';
  in_RDI._M_node[0x31]._M_color = in_RDI._M_node[0x31]._M_color + _S_black;
  return;
}

Assistant:

void HPresolve::markRowDeleted(HighsInt row) {
  assert(!rowDeleted[row]);

  // remove equations from set of equations
  if (model->row_lower_[row] == model->row_upper_[row] &&
      eqiters[row] != equations.end()) {
    equations.erase(eqiters[row]);
    eqiters[row] = equations.end();
  }

  // prevents row from being added to change vector
  changedRowFlag[row] = true;
  rowDeleted[row] = true;
  ++numDeletedRows;
}